

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void QHashPrivate::Node<void_const*,QCss::StyleSheet>::createInPlace<QCss::StyleSheet_const&>
               (Node<const_void_*,_QCss::StyleSheet> *n,void **k,StyleSheet *args)

{
  Data *pDVar1;
  Data *pDVar2;
  Data *pDVar3;
  Data *pDVar4;
  Data *pDVar5;
  Data *pDVar6;
  int iVar7;
  
  n->key = *k;
  pDVar1 = (args->styleRules).d.d;
  (n->value).styleRules.d.d = pDVar1;
  (n->value).styleRules.d.ptr = (args->styleRules).d.ptr;
  (n->value).styleRules.d.size = (args->styleRules).d.size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  pDVar2 = (args->mediaRules).d.d;
  (n->value).mediaRules.d.d = pDVar2;
  (n->value).mediaRules.d.ptr = (args->mediaRules).d.ptr;
  (n->value).mediaRules.d.size = (args->mediaRules).d.size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pDVar3 = (args->pageRules).d.d;
  (n->value).pageRules.d.d = pDVar3;
  (n->value).pageRules.d.ptr = (args->pageRules).d.ptr;
  (n->value).pageRules.d.size = (args->pageRules).d.size;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pDVar4 = (args->animationRules).d.d;
  (n->value).animationRules.d.d = pDVar4;
  (n->value).animationRules.d.ptr = (args->animationRules).d.ptr;
  (n->value).animationRules.d.size = (args->animationRules).d.size;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pDVar5 = (args->importRules).d.d;
  (n->value).importRules.d.d = pDVar5;
  (n->value).importRules.d.ptr = (args->importRules).d.ptr;
  (n->value).importRules.d.size = (args->importRules).d.size;
  if (pDVar5 != (Data *)0x0) {
    LOCK();
    (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  iVar7 = args->depth;
  (n->value).origin = args->origin;
  (n->value).depth = iVar7;
  pDVar6 = (args->nameIndex).d;
  (n->value).nameIndex.d = pDVar6;
  (n->value).nameIndex.m_size = (args->nameIndex).m_size;
  if ((pDVar6 != (Data *)0x0) && (*(int *)pDVar6 != -1)) {
    LOCK();
    *(int *)pDVar6 = *(int *)pDVar6 + 1;
    UNLOCK();
  }
  pDVar6 = (args->idIndex).d;
  (n->value).idIndex.d = pDVar6;
  (n->value).idIndex.m_size = (args->idIndex).m_size;
  if ((pDVar6 != (Data *)0x0) && (*(int *)pDVar6 != -1)) {
    LOCK();
    *(int *)pDVar6 = *(int *)pDVar6 + 1;
    UNLOCK();
  }
  return;
}

Assistant:

static void createInPlace(Node *n, Key &&k, Args &&... args)
    { new (n) Node{ std::move(k), T(std::forward<Args>(args)...) }; }